

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wol.cc
# Opt level: O2

void __thiscall rcdiscover::WOL::WOL(WOL *this,uint64_t hardware_addr,uint16_t port)

{
  array<unsigned_char,_6UL> aVar1;
  
  aVar1 = toByteArray<(unsigned_char)6>(this,hardware_addr);
  *(int *)(this->hardware_addr_)._M_elems = aVar1._M_elems._0_4_;
  *(short *)((this->hardware_addr_)._M_elems + 4) = aVar1._M_elems._4_2_;
  this->port_ = port;
  return;
}

Assistant:

WOL::WOL(uint64_t hardware_addr, uint16_t port) noexcept :
  hardware_addr_(toByteArray<6>(std::move(hardware_addr))),
  port_{port}
{ }